

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLXWindow glfwGetGLXWindow(GLFWwindow *handle)

{
  long in_RDI;
  _GLFWwindow *window;
  undefined8 local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = 0;
  }
  else if (*(int *)(in_RDI + 0x1f0) == 0) {
    _glfwInputError(0x1000a,(char *)0x0);
    local_8 = 0;
  }
  else {
    local_8 = *(GLXWindow *)(in_RDI + 0x270);
  }
  return local_8;
}

Assistant:

GLFWAPI GLXWindow glfwGetGLXWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return None;
    }

    return window->context.glx.window;
}